

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::detail::format_dragon
               (fp value,bool is_predecessor_closer,int num_digits,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int in_ECX;
  byte in_DL;
  int in_ESI;
  ulong in_RDI;
  buffer<char> *in_R8;
  int *in_R9;
  bool bVar6;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_3;
  int i;
  char digit_2;
  int result_1;
  bool high;
  bool low;
  int digit_1;
  char *data;
  bool even;
  uint64_t significand;
  int shift;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  undefined7 in_stack_fffffffffffffc20;
  char in_stack_fffffffffffffc27;
  size_t in_stack_fffffffffffffc28;
  bigint *in_stack_fffffffffffffc30;
  bigint *in_stack_fffffffffffffc38;
  bigint *in_stack_fffffffffffffc40;
  bigint *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  bigint *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  int local_34c;
  int local_340;
  char local_33c;
  int local_338;
  undefined1 *local_300;
  undefined1 local_2f8 [176];
  undefined1 local_248 [544];
  int *local_28;
  buffer<char> *local_20;
  int local_18;
  byte local_11;
  ulong local_10;
  int local_8;
  
  local_11 = in_DL & 1;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_10 = in_RDI;
  local_8 = in_ESI;
  bigint::bigint(in_stack_fffffffffffffc40);
  bigint::bigint(in_stack_fffffffffffffc40);
  bigint::bigint(in_stack_fffffffffffffc40);
  bigint::bigint(in_stack_fffffffffffffc40);
  local_300 = (undefined1 *)0x0;
  iVar2 = 1;
  if ((local_11 & 1) != 0) {
    iVar2 = 2;
  }
  if (local_8 < 0) {
    if (*local_28 < 0) {
      bigint::assign_pow10(in_stack_fffffffffffffc30,(int)(in_stack_fffffffffffffc28 >> 0x20));
      bigint::assign(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      if (iVar2 != 1) {
        bigint::assign(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        bigint::operator<<=(in_stack_fffffffffffffc48,
                            (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        local_300 = local_2f8;
      }
      iVar2 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
      bigint::operator*=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      bigint::operator<<=(in_stack_fffffffffffffc48,iVar2);
    }
    else {
      bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      iVar3 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
      bigint::assign_pow10(in_stack_fffffffffffffc30,(int)(in_stack_fffffffffffffc28 >> 0x20));
      bigint::operator<<=(in_stack_fffffffffffffc48,iVar3);
      bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      if (iVar2 != 1) {
        bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        local_300 = local_2f8;
      }
    }
  }
  else {
    bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    iVar3 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
    bigint::operator<<=(in_stack_fffffffffffffc48,iVar3);
    bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bigint::operator<<=(in_stack_fffffffffffffc48,iVar3);
    if (iVar2 != 1) {
      bigint::assign(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      bigint::operator<<=(in_stack_fffffffffffffc48,iVar3);
      local_300 = local_2f8;
    }
    bigint::assign_pow10(in_stack_fffffffffffffc30,(int)(in_stack_fffffffffffffc28 >> 0x20));
    bigint::operator<<=(in_stack_fffffffffffffc48,iVar3);
  }
  if (local_18 < 0) {
    if (local_300 == (undefined1 *)0x0) {
      local_300 = local_248;
    }
    bVar6 = (local_10 & 1) == 0;
    local_18 = 0;
    pcVar5 = buffer<char>::data(local_20);
    while( true ) {
      iVar2 = bigint::divmod_assign(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      iVar3 = compare(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      iVar3 = iVar3 - (uint)bVar6;
      iVar4 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          in_stack_fffffffffffffc60,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      bVar1 = 0 < (int)(iVar4 + (uint)bVar6);
      iVar4 = local_18 + 1;
      pcVar5[local_18] = (char)iVar2 + '0';
      if ((iVar3 < 0) || (bVar1)) break;
      local_18 = iVar4;
      bigint::operator*=((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         in_stack_fffffffffffffc1c);
      bigint::operator*=((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         in_stack_fffffffffffffc1c);
      if (local_300 != local_248) {
        bigint::operator*=((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                           in_stack_fffffffffffffc1c);
      }
    }
    if (iVar3 < 0) {
      local_18 = iVar4;
      if ((bVar1) &&
         ((iVar3 = add_compare((bigint *)
                               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                               in_stack_fffffffffffffc60,
                               (bigint *)
                               CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58)),
          0 < iVar3 || ((iVar3 == 0 && (iVar2 % 2 != 0)))))) {
        pcVar5[local_18 + -1] = pcVar5[local_18 + -1] + '\x01';
      }
    }
    else {
      pcVar5[local_18] = pcVar5[local_18] + '\x01';
      local_18 = iVar4;
    }
    to_unsigned<int>(0);
    buffer<char>::try_resize((buffer<char> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    *local_28 = *local_28 - (local_18 + -1);
  }
  else {
    *local_28 = *local_28 - (local_18 + -1);
    if (local_18 == 0) {
      bigint::operator*=((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                         in_stack_fffffffffffffc1c);
      add_compare((bigint *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                  in_stack_fffffffffffffc60,
                  (bigint *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      buffer<char>::push_back
                ((buffer<char> *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                 (char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    }
    else {
      to_unsigned<int>(0);
      buffer<char>::try_resize((buffer<char> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      for (local_338 = 0; local_338 < local_18 + -1; local_338 = local_338 + 1) {
        iVar2 = bigint::divmod_assign(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        local_33c = (char)iVar2;
        pcVar5 = buffer<char>::operator[]<int>(local_20,local_338);
        *pcVar5 = local_33c + '0';
        bigint::operator*=((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                           in_stack_fffffffffffffc1c);
      }
      local_340 = bigint::divmod_assign(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      iVar2 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                          in_stack_fffffffffffffc60,
                          (bigint *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
      if ((0 < iVar2) || ((iVar2 == 0 && (local_340 % 2 != 0)))) {
        if (local_340 == 9) {
          pcVar5 = buffer<char>::operator[]<int>(local_20,local_18 + -1);
          *pcVar5 = ':';
          iVar2 = local_18;
          while( true ) {
            local_34c = iVar2 + -1;
            bVar6 = false;
            if (0 < local_34c) {
              pcVar5 = buffer<char>::operator[]<int>(local_20,local_34c);
              bVar6 = *pcVar5 == ':';
            }
            if (!bVar6) break;
            pcVar5 = buffer<char>::operator[]<int>(local_20,local_34c);
            *pcVar5 = '0';
            pcVar5 = buffer<char>::operator[]<int>(local_20,iVar2 + -2);
            *pcVar5 = *pcVar5 + '\x01';
            iVar2 = local_34c;
          }
          pcVar5 = buffer<char>::operator[]<int>(local_20,0);
          if (*pcVar5 == ':') {
            pcVar5 = buffer<char>::operator[]<int>(local_20,0);
            *pcVar5 = '1';
            *local_28 = *local_28 + 1;
          }
          goto LAB_0013b59f;
        }
        local_340 = local_340 + 1;
      }
      in_stack_fffffffffffffc27 = (char)local_340 + '0';
      pcVar5 = buffer<char>::operator[]<int>(local_20,local_18 + -1);
      *pcVar5 = in_stack_fffffffffffffc27;
    }
  }
LAB_0013b59f:
  bigint::~bigint((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  bigint::~bigint((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  bigint::~bigint((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  bigint::~bigint((bigint *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(fp value, bool is_predecessor_closer,
                                          int num_digits, buffer<char>& buf,
                                          int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}